

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O0

object * newObj(int cl)

{
  object *poVar1;
  object *local_20;
  object *x;
  object *newObject;
  int ret;
  int cl_local;
  
  poVar1 = topScope;
  local_20 = topScope;
  stringCopy(idName,guard->name);
  newObject._0_4_ = stringCompare(idName,poVar1->next->name);
  while ((int)newObject != 0) {
    local_20 = local_20->next;
    newObject._0_4_ = stringCompare(idName,local_20->next->name);
  }
  if (local_20->next == guard) {
    poVar1 = (object *)calloc(1,0x90);
    poVar1->cl = cl;
    poVar1->next = guard;
    local_20->next = poVar1;
    stringCopy(idName,poVar1->name);
    return poVar1;
  }
  mark("multiple definition");
  exit(-1);
}

Assistant:

object *newObj(int cl) {
	variable int ret;
	variable struct object *newObject; variable struct object *x;
	ret = 0; x = topScope;
	stringCopy(idName,guard->name);
	ret = stringCompare(idName,x->next->name);
	while (ret != 0) {
		x = x->next;
		ret = stringCompare(idName,x->next->name);
	}
	if (x->next == guard) {
		allocMem(newObject);
		newObject->cl = cl;	newObject->next = guard; x->next = newObject;
		stringCopy(idName,newObject->name);	
		return newObject;
	} else {
		mark("multiple definition");
		exit(-1);
	}
}